

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetBuilder.h
# Opt level: O0

void __thiscall Refal2::CSetBuilder<unsigned_int>::Reset(CSetBuilder<unsigned_int> *this)

{
  CSetBuilder<unsigned_int> *this_local;
  
  this->fullSetStatus = S_Thru;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::clear(&this->yes);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::clear(&this->no);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::clear(&this->thru)
  ;
  return;
}

Assistant:

void CSetBuilder<T>::Reset()
{
	fullSetStatus = S_Thru;
	yes.clear();
	no.clear();
	thru.clear();
}